

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

spv_result_t
spvValidateBinary(spv_const_context context,uint32_t *words,size_t num_words,
                 spv_diagnostic *pDiagnostic)

{
  spv_result_t sVar1;
  undefined1 local_798 [4];
  spv_result_t result;
  ValidationState_t vstate;
  spv_validator_options default_options;
  spv_context_t hijack_context;
  spv_diagnostic *pDiagnostic_local;
  size_t num_words_local;
  uint32_t *words_local;
  spv_const_context context_local;
  
  hijack_context.consumer._M_invoker = (_Invoker_type)pDiagnostic;
  spv_context_t::spv_context_t((spv_context_t *)&default_options,context);
  if (hijack_context.consumer._M_invoker != (_Invoker_type)0x0) {
    *(undefined8 *)hijack_context.consumer._M_invoker = 0;
    spvtools::UseDiagnosticAsMessageConsumer
              ((spv_context)&default_options,(spv_diagnostic *)hijack_context.consumer._M_invoker);
  }
  vstate._1824_8_ = spvValidatorOptionsCreate();
  spvtools::val::ValidationState_t::ValidationState_t
            ((ValidationState_t *)local_798,(spv_const_context)&default_options,
             (spv_const_validator_options)vstate._1824_8_,words,num_words,
             (anonymous_namespace)::kDefaultMaxNumOfWarnings);
  sVar1 = spvtools::val::anon_unknown_2::ValidateBinaryUsingContextAndValidationState
                    ((spv_context_t *)&default_options,words,num_words,
                     (spv_diagnostic *)hijack_context.consumer._M_invoker,
                     (ValidationState_t *)local_798);
  spvValidatorOptionsDestroy((spv_validator_options)vstate._1824_8_);
  spvtools::val::ValidationState_t::~ValidationState_t((ValidationState_t *)local_798);
  spv_context_t::~spv_context_t((spv_context_t *)&default_options);
  return sVar1;
}

Assistant:

spv_result_t spvValidateBinary(const spv_const_context context,
                               const uint32_t* words, const size_t num_words,
                               spv_diagnostic* pDiagnostic) {
  spv_context_t hijack_context = *context;
  if (pDiagnostic) {
    *pDiagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, pDiagnostic);
  }

  // This interface is used for default command line options.
  spv_validator_options default_options = spvValidatorOptionsCreate();

  // Create the ValidationState using the context and default options.
  spvtools::val::ValidationState_t vstate(&hijack_context, default_options,
                                          words, num_words,
                                          kDefaultMaxNumOfWarnings);

  spv_result_t result =
      spvtools::val::ValidateBinaryUsingContextAndValidationState(
          hijack_context, words, num_words, pDiagnostic, &vstate);

  spvValidatorOptionsDestroy(default_options);
  return result;
}